

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read_csv.cpp
# Opt level: O1

void duckdb::CSVReaderSerialize
               (Serializer *serializer,optional_ptr<duckdb::FunctionData,_true> bind_data_p,
               TableFunction *function)

{
  NotImplementedException *this;
  string local_40;
  
  this = (NotImplementedException *)__cxa_allocate_exception(0x10);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"CSVReaderSerialize not implemented","");
  NotImplementedException::NotImplementedException(this,&local_40);
  __cxa_throw(this,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static void CSVReaderSerialize(Serializer &serializer, const optional_ptr<FunctionData> bind_data_p,
                               const TableFunction &function) {
	throw NotImplementedException("CSVReaderSerialize not implemented");
	// auto &bind_data = bind_data_p->Cast<MultiFileBindData>();
	// auto &csv_data = bind_data.bind_data->Cast<ReadCSVData>();
	// serializer.WriteProperty(100, "extra_info", function.extra_info);
	// // generate the serialized data
	// SerializedReadCSVData serialized_data;
	// serialized_data.return_types = serialized_data.csv_types = bind_data.types;
	// serialized_data.return_names = serialized_data.csv_names = bind_data.names;
	// serialized_data.files = bind_data.file_list->GetAllFiles();
	// serialized_data.filename_col_idx = csv_data.filename_col_idx;
	// serialized_data.options.options = csv_data.options;
	// serialized_data.options.file_options = bind_data.file_options;
	// serialized_data.reader_bind = bind_data.reader_bind;
	// serializer.WriteProperty(101, "csv_data", serialized_data);
}